

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Output.cxx
# Opt level: O0

int __thiscall Fl_Value_Output::handle(Fl_Value_Output *this,int event)

{
  uchar uVar1;
  int iVar2;
  double dVar3;
  double local_50;
  int local_2c;
  int mx;
  int delta;
  double v;
  int event_local;
  Fl_Value_Output *this_local;
  
  dVar3 = Fl_Valuator::step(&this->super_Fl_Valuator);
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    iVar2 = Fl::event_x();
    switch(event) {
    case 1:
      handle::ix = iVar2;
      handle::drag = Fl::event_button();
      Fl_Valuator::handle_push(&this->super_Fl_Valuator);
      this_local._4_4_ = 1;
      break;
    case 2:
      Fl_Valuator::handle_release(&this->super_Fl_Valuator);
      this_local._4_4_ = 1;
      break;
    case 3:
    case 4:
      this_local._4_4_ = 1;
      break;
    case 5:
      local_2c = Fl::event_x();
      local_2c = local_2c - handle::ix;
      if (local_2c < 6) {
        if (local_2c < -5) {
          local_2c = local_2c + 5;
        }
        else {
          local_2c = 0;
        }
      }
      else {
        local_2c = local_2c + -5;
      }
      if (handle::drag == 2) {
        dVar3 = Fl_Valuator::previous_value(&this->super_Fl_Valuator);
        _mx = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar3,local_2c * 10);
      }
      else if (handle::drag == 3) {
        dVar3 = Fl_Valuator::previous_value(&this->super_Fl_Valuator);
        _mx = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar3,local_2c * 100);
      }
      else {
        dVar3 = Fl_Valuator::previous_value(&this->super_Fl_Valuator);
        _mx = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar3,local_2c);
      }
      dVar3 = Fl_Valuator::round(&this->super_Fl_Valuator,_mx);
      uVar1 = soft(this);
      if (uVar1 == '\0') {
        local_50 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar3);
      }
      else {
        local_50 = Fl_Valuator::softclamp(&this->super_Fl_Valuator,dVar3);
      }
      Fl_Valuator::handle_drag(&this->super_Fl_Valuator,local_50);
      this_local._4_4_ = 1;
      break;
    default:
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Value_Output::handle(int event) {
  if (!step()) return 0;
  double v;
  int delta;
  int mx = Fl::event_x();
  static int ix, drag;
  switch (event) {
  case FL_PUSH:
    ix = mx;
    drag = Fl::event_button();
    handle_push();
    return 1;
  case FL_DRAG:
    delta = Fl::event_x()-ix;
    if (delta > 5) delta -= 5;
    else if (delta < -5) delta += 5;
    else delta = 0;
    switch (drag) {
    case 3: v = increment(previous_value(),delta*100); break;
    case 2: v = increment(previous_value(),delta*10); break;
    default:v = increment(previous_value(),delta); break;
    }
    v = round(v);
    handle_drag(soft()?softclamp(v):clamp(v));;
    return 1;
  case FL_RELEASE:
    handle_release();
    return 1;
  case FL_ENTER :
  case FL_LEAVE :
    return 1;
  default:
    return 0;
  }
}